

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.cc
# Opt level: O0

S2CellId * __thiscall S2CellId::ToToken_abi_cxx11_(S2CellId *this)

{
  int iVar1;
  uint64 *in_RSI;
  size_t num_zero_digits;
  allocator local_19 [9];
  S2CellId *this_local;
  
  this_local = this;
  if (*in_RSI == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"X",local_19);
    std::allocator<char>::~allocator((allocator<char> *)local_19);
  }
  else {
    iVar1 = Bits::FindLSBSetNonZero64(*in_RSI);
    HexFormatString_abi_cxx11_((uint64)this,*in_RSI >> ((byte)((long)(iVar1 / 4) << 2) & 0x3f));
  }
  return this;
}

Assistant:

string S2CellId::ToToken() const {
  // Simple implementation: print the id in hex without trailing zeros.
  // Using hex has the advantage that the tokens are case-insensitive, all
  // characters are alphanumeric, no characters require any special escaping
  // in queries for most indexing systems, and it's easy to compare cell
  // tokens against the feature ids of the corresponding features.
  //
  // Using base 64 would produce slightly shorter tokens, but for typical cell
  // sizes used during indexing (up to level 15 or so) the average savings
  // would be less than 2 bytes per cell which doesn't seem worth it.

  // "0" with trailing 0s stripped is the empty string, which is not a
  // reasonable token.  Encode as "X".
  if (id_ == 0) return "X";
  const size_t num_zero_digits = Bits::FindLSBSetNonZero64(id_) / 4;
  return HexFormatString(id_ >> (4 * num_zero_digits), 16 - num_zero_digits);
}